

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::ProcessMark(Recycler *this,bool background)

{
  MarkContext *markContext;
  
  markContext = &this->markContext;
  if (this->enableScanInteriorPointers == true) {
    ProcessMarkContext<false,true>(this,markContext);
  }
  else {
    ProcessMarkContext<false,false>(this,markContext);
  }
  MarkContext::VerifyPostMarkState(markContext);
  return;
}

Assistant:

void
Recycler::ProcessMark(bool background)
{
#if ENABLE_CONCURRENT_GC
    if (background)
    {
        GCETW(GC_BACKGROUNDMARK_START, (this, backgroundRescanCount));
    }
    else
#endif
    {
        GCETW(GC_MARK_START, (this));
    }

    RECYCLER_PROFILE_EXEC_THREAD_BEGIN(background, this, Js::MarkPhase);

    if (this->enableScanInteriorPointers)
    {
        this->ProcessMarkContext</* parallel */ false, /* interior */ true>(&markContext);
    }
    else
    {
        this->ProcessMarkContext</* parallel */ false, /* interior */ false>(&markContext);
    }

    RECYCLER_PROFILE_EXEC_THREAD_END(background, this, Js::MarkPhase);

#if ENABLE_CONCURRENT_GC
    if (background)
    {
        GCETW(GC_BACKGROUNDMARK_STOP, (this, backgroundRescanCount));
    }
    else
#endif
    {
        GCETW(GC_MARK_STOP, (this));
    }

    DebugOnly(this->markContext.VerifyPostMarkState());
}